

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonReporter::sectionEnded(JsonReporter *this,SectionStats *param_1)

{
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::pop_back
            (&(this->m_arrayWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::pop_back
            (&(this->m_objectWriters).c);
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
            (&(this->m_writers).c);
  return;
}

Assistant:

void JsonReporter::sectionEnded( SectionStats const& /*sectionStats */) {
        // End the subpath array
        endArray();
        // TODO: metadata
        // TODO: what info do we have here?

        // End the section object
        endObject();
    }